

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Server_setMethodNode_callback
          (UA_Server *server,UA_NodeId methodNodeId,UA_MethodCallback method,void *handle)

{
  UA_StatusCode UVar1;
  UA_MethodCallback local_18;
  addMethodCallback cb;
  
  local_18 = method;
  cb.callback = (UA_MethodCallback)handle;
  UVar1 = UA_Server_editNode(server,&adminSession,&methodNodeId,editMethodCallback,&local_18);
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_setMethodNode_callback(UA_Server *server, const UA_NodeId methodNodeId,
                                 UA_MethodCallback method, void *handle) {
    struct addMethodCallback cb = { method, handle };
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession,
                                              &methodNodeId, editMethodCallback, &cb);
    UA_RCU_UNLOCK();
    return retval;
}